

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_array_ops.cpp
# Opt level: O0

Read<int> __thiscall Omega_h::divide_each_by<int>(Omega_h *this,Read<int> *a,int b)

{
  void *extraout_RDX;
  Read<int> RVar1;
  Write<int> local_e0;
  undefined1 local_d0 [8];
  type_conflict f;
  allocator local_91;
  string local_90 [32];
  undefined1 local_70 [8];
  Write<int> c;
  int b_local;
  Read<int> *a_local;
  ulong local_20;
  ulong local_10;
  
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_10 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_10 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  c.shared_alloc_.direct_ptr._4_4_ = b;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"",&local_91);
  Write<int>::Write((Write<int> *)local_70,(LO)(local_10 >> 2),(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  Write<int>::Write((Write<int> *)local_d0,(Write<int> *)local_70);
  Read<int>::Read((Read<int> *)&f.c.shared_alloc_.direct_ptr,a);
  f.a.write_.shared_alloc_.direct_ptr._0_4_ = c.shared_alloc_.direct_ptr._4_4_;
  if (((ulong)(a->write_).shared_alloc_.alloc & 1) == 0) {
    local_20 = ((a->write_).shared_alloc_.alloc)->size;
  }
  else {
    local_20 = (ulong)(a->write_).shared_alloc_.alloc >> 3;
  }
  parallel_for<Omega_h::divide_each_by<int>(Omega_h::Read<int>,int)::_lambda(int)_1_>
            ((LO)(local_20 >> 2),(type_conflict *)local_d0,"divide_each_by");
  Write<int>::Write(&local_e0,(Write<int> *)local_70);
  Read<int>::Read((Read<int> *)this,&local_e0);
  Write<int>::~Write(&local_e0);
  divide_each_by<int>(Omega_h::Read<int>,int)::{lambda(int)#1}::~Read((_lambda_int__1_ *)local_d0);
  Write<int>::~Write((Write<int> *)local_70);
  RVar1.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar1.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Read<int>)RVar1.write_.shared_alloc_;
}

Assistant:

Read<T> divide_each_by(Read<T> a, T b) {
  Write<T> c(a.size());
  auto f = OMEGA_H_LAMBDA(LO i) { c[i] = a[i] / b; };
  parallel_for(a.size(), f, "divide_each_by");
  return c;
}